

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O0

int_fast64_t leapcorr(state *sp,time_t t)

{
  int local_2c;
  int i;
  lsinfo *lp;
  time_t t_local;
  state *sp_local;
  
  local_2c = sp->leapcnt;
  do {
    local_2c = local_2c + -1;
    if (local_2c < 0) {
      return 0;
    }
  } while (t < sp->lsis[local_2c].trans);
  return sp->lsis[local_2c].corr;
}

Assistant:

static int_fast64_t leapcorr( struct state const * sp, time_t t )
{
    struct lsinfo const * lp;
    int i;

    i = sp->leapcnt;

    while ( --i >= 0 )
    {
        lp = &sp->lsis[ i ];

        if ( t >= lp->trans )
        {
            return lp->corr;
        }
    }

    return 0;
}